

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

int __thiscall ON_Brep::RemoveWireEdges(ON_Brep *this,bool bDeleteVertices)

{
  int iVar1;
  int iVar2;
  ON_BrepEdge *pOVar3;
  int local_1c;
  int count;
  int ei;
  int rc;
  bool bDeleteVertices_local;
  ON_Brep *this_local;
  
  count = 0;
  iVar1 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,local_1c);
    if (local_1c == pOVar3->m_edge_index) {
      pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                         ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,local_1c);
      iVar2 = ON_SimpleArray<int>::Count(&pOVar3->m_ti);
      if (iVar2 == 0) {
        count = count + 1;
        pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                           ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,local_1c);
        DeleteEdge(this,pOVar3,bDeleteVertices);
      }
    }
  }
  return count;
}

Assistant:

int ON_Brep::RemoveWireEdges( bool bDeleteVertices )
{
  int rc = 0;
  int ei, count = m_E.Count();
  for ( ei = 0; ei < count; ei++ )
  {
    if ( ei == m_E[ei].m_edge_index && 0 == m_E[ei].m_ti.Count() )
    {
      rc++;
      DeleteEdge( m_E[ei], bDeleteVertices );
    }
  }
  return rc;
}